

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int normal_scanComment(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  
  iVar5 = -1;
  if (end != ptr && -1 < (long)end - (long)ptr) {
    iVar5 = 0;
    if (*ptr == '-') {
      pbVar1 = (byte *)(ptr + 1);
      pcVar7 = end;
LAB_0048dbc3:
      do {
        ptr = (char *)pbVar1;
        uVar6 = (long)end - (long)ptr;
        if ((long)uVar6 < 1) {
          return -1;
        }
        bVar4 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
        if ((ulong)bVar4 < 9) {
          switch(bVar4) {
          case 2:
          case 3:
          case 4:
            goto switchD_0048dc12_caseD_2;
          case 5:
            if (uVar6 == 1) {
              return -2;
            }
            iVar5 = (*enc[3].literalScanners[1])
                              (enc,ptr,pcVar7,
                               (char **)((long)&switchD_0048dc12::switchdataD_005864b0 +
                                        (long)(int)(&switchD_0048dc12::switchdataD_005864b0)[bVar4])
                              );
            if (iVar5 == 0) {
              pbVar1 = (byte *)ptr + 2;
              pcVar7 = extraout_RDX;
              goto LAB_0048dbc3;
            }
            break;
          case 6:
            if (uVar6 < 3) {
              return -2;
            }
            iVar5 = (*enc[3].sameName)(enc,ptr,pcVar7);
            if (iVar5 == 0) {
              pbVar1 = (byte *)ptr + 3;
              pcVar7 = extraout_RDX_01;
              goto LAB_0048dbc3;
            }
            break;
          case 7:
            if (uVar6 < 4) {
              return -2;
            }
            iVar5 = (*enc[3].nameMatchesAscii)
                              (enc,ptr,pcVar7,
                               (char *)((long)&switchD_0048dc12::switchdataD_005864b0 +
                                       (long)(int)(&switchD_0048dc12::switchdataD_005864b0)[bVar4]))
            ;
            if (iVar5 == 0) {
              pbVar1 = (byte *)ptr + 4;
              pcVar7 = extraout_RDX_00;
              goto LAB_0048dbc3;
            }
          }
          iVar5 = 0;
          goto LAB_0048dc7b;
        }
        if (bVar4 != 0x1b) {
switchD_0048dc12_caseD_2:
          pbVar1 = (byte *)ptr + 1;
          goto LAB_0048dbc3;
        }
        pbVar1 = (byte *)ptr + 1;
        if ((byte *)end == pbVar1 || (long)end - (long)pbVar1 < 0) {
          return -1;
        }
      } while (*pbVar1 != 0x2d);
      pbVar1 = (byte *)ptr + 2;
      if ((byte *)end == pbVar1 || (long)end - (long)pbVar1 < 0) {
        return -1;
      }
      pbVar2 = (byte *)ptr + 3;
      pbVar3 = (byte *)ptr + 2;
      ptr = (char *)pbVar1;
      if (*pbVar3 == 0x3e) {
        ptr = (char *)pbVar2;
      }
      iVar5 = 0xd;
      if (*pbVar3 != 0x3e) {
        iVar5 = 0;
      }
    }
LAB_0048dc7b:
    *nextTokPtr = ptr;
  }
  return iVar5;
}

Assistant:

static int PTRCALL
PREFIX(scanComment)(const ENCODING *enc, const char *ptr,
                    const char *end, const char **nextTokPtr)
{
  if (HAS_CHAR(enc, ptr, end)) {
    if (!CHAR_MATCHES(enc, ptr, ASCII_MINUS)) {
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
    ptr += MINBPC(enc);
    while (HAS_CHAR(enc, ptr, end)) {
      switch (BYTE_TYPE(enc, ptr)) {
      INVALID_CASES(ptr, nextTokPtr)
      case BT_MINUS:
        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        if (CHAR_MATCHES(enc, ptr, ASCII_MINUS)) {
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          *nextTokPtr = ptr + MINBPC(enc);
          return XML_TOK_COMMENT;
        }
        break;
      default:
        ptr += MINBPC(enc);
        break;
      }
    }
  }
  return XML_TOK_PARTIAL;
}